

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::Setup::Setup
          (Setup *this,ScriptFunction *function,Var *inParams,int inSlotsCount)

{
  FunctionBody *pFVar1;
  
  this->inParams = inParams;
  this->function = function;
  pFVar1 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  this->executeFunction = pFVar1;
  this->inSlotsCount = inSlotsCount;
  this->callFlags = CallFlags_None;
  *(undefined4 *)((long)&this->callFlags + 3) = 0;
  SetupInternal(this);
  return;
}

Assistant:

InterpreterStackFrame::Setup::Setup(Js::ScriptFunction * function, Var * inParams, int inSlotsCount)
        : function(function),
          inParams(inParams),
          inSlotsCount(inSlotsCount),
          executeFunction(function->GetFunctionBody()),
          callFlags(CallFlags_None),
          bailedOutOfInlinee(false),
          bailedOut(false),
          isGeneratorFrame(false)
    {
        SetupInternal();
    }